

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O0

int wally_ec_sig_to_public_key
              (uchar *bytes,size_t bytes_len,uchar *sig,size_t sig_len,uchar *bytes_out,size_t len)

{
  int iVar1;
  bool bVar2;
  _Bool ok;
  size_t sStack_d8;
  int recid;
  size_t len_in_out;
  secp256k1_context *ctx;
  secp256k1_ecdsa_recoverable_signature sig_secp;
  secp256k1_pubkey pub;
  size_t len_local;
  uchar *bytes_out_local;
  size_t sig_len_local;
  uchar *sig_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  len_in_out = (size_t)secp_ctx();
  sStack_d8 = 0x21;
  if ((secp256k1_context *)len_in_out == (secp256k1_context *)0x0) {
    bytes_local._4_4_ = -3;
  }
  else if ((((bytes == (uchar *)0x0) || (bytes_len != 0x20)) || (sig == (uchar *)0x0)) ||
          (((sig_len != 0x41 || (bytes_out == (uchar *)0x0)) || (len != 0x21)))) {
    bytes_local._4_4_ = -2;
  }
  else {
    iVar1 = secp256k1_ecdsa_recoverable_signature_parse_compact
                      ((secp256k1_context *)len_in_out,
                       (secp256k1_ecdsa_recoverable_signature *)((long)&ctx + 7),sig + 1,
                       *sig - 0x1b & 3);
    bVar2 = false;
    if (iVar1 != 0) {
      iVar1 = secp256k1_ecdsa_recover
                        ((secp256k1_context *)len_in_out,(secp256k1_pubkey *)(sig_secp.data + 0x39),
                         (secp256k1_ecdsa_recoverable_signature *)((long)&ctx + 7),bytes);
      bVar2 = false;
      if (iVar1 != 0) {
        iVar1 = pubkey_serialize(bytes_out,&stack0xffffffffffffff28,
                                 (secp256k1_pubkey *)(sig_secp.data + 0x39),0x102);
        bVar2 = iVar1 != 0;
      }
    }
    wally_clear_2(sig_secp.data + 0x39,0x40,(void *)((long)&ctx + 7),0x41);
    bytes_local._4_4_ = -2;
    if (bVar2) {
      bytes_local._4_4_ = 0;
    }
  }
  return bytes_local._4_4_;
}

Assistant:

int wally_ec_sig_to_public_key(const unsigned char *bytes, size_t bytes_len,
                               const unsigned char *sig, size_t sig_len,
                               unsigned char *bytes_out, size_t len)
{
    secp256k1_pubkey pub;
    secp256k1_ecdsa_recoverable_signature sig_secp;
    const secp256k1_context *ctx = secp_ctx();
    size_t len_in_out = EC_PUBLIC_KEY_LEN;
    int recid;
    bool ok;

    if (!ctx)
        return WALLY_ENOMEM;

    if (!bytes || bytes_len != EC_MESSAGE_HASH_LEN ||
        !sig || sig_len != EC_SIGNATURE_RECOVERABLE_LEN ||
        !bytes_out || len != EC_PUBLIC_KEY_LEN)
        return WALLY_EINVAL;

    recid = (sig[0] - 27) & 3;
    ok = secp256k1_ecdsa_recoverable_signature_parse_compact(ctx, &sig_secp, &sig[1], recid) &&
         secp256k1_ecdsa_recover(ctx, &pub, &sig_secp, bytes) &&
         pubkey_serialize(bytes_out, &len_in_out, &pub, PUBKEY_COMPRESSED);

    wally_clear_2(&pub, sizeof(pub), &sig_secp, sizeof(sig_secp));
    return ok ? WALLY_OK : WALLY_EINVAL;
}